

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.hh
# Opt level: O1

void __thiscall MemoryImage::insert(MemoryImage *this,uintb addr,uintb val)

{
  LowlevelError *this_00;
  string local_40;
  
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Writing to read-only MemoryBank","");
  LowlevelError::LowlevelError(this_00,&local_40);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

virtual void insert(uintb addr,uintb val) {
    throw LowlevelError("Writing to read-only MemoryBank"); }